

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

Error * ot::commissioner::PendingDatasetFromJson
                  (Error *__return_storage_ptr__,PendingOperationalDataset *aDataset,string *aJson)

{
  bool bVar1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar2;
  string_view fmt;
  format_args args;
  JsonException *e;
  exception *e_1;
  anon_class_1_0_00000001 local_272;
  v10 local_271;
  v10 *local_270;
  size_t local_268;
  string local_260;
  Error local_240;
  function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
  local_218;
  string local_1f8;
  input_adapter local_1d8;
  undefined1 local_1c8 [8];
  Json json;
  PendingOperationalDataset local_1a8;
  undefined1 local_c1;
  string *local_c0;
  string *aJson_local;
  PendingOperationalDataset *aDataset_local;
  Error *error;
  undefined1 local_98 [16];
  v10 *local_88;
  ulong local_80;
  v10 *local_78;
  size_t sStack_70;
  string *local_68;
  v10 *local_60;
  v10 **local_58;
  v10 **local_50;
  v10 *local_48;
  size_t sStack_40;
  Error **local_38;
  undefined1 *local_30;
  Error **local_28;
  undefined8 local_20;
  undefined1 *local_18;
  Error **local_10;
  
  local_c1 = 0;
  local_c0 = aJson;
  aJson_local = (string *)aDataset;
  aDataset_local = (PendingOperationalDataset *)__return_storage_ptr__;
  Error::Error(__return_storage_ptr__);
  PendingOperationalDataset::PendingOperationalDataset(&local_1a8);
  PendingOperationalDataset::operator=((PendingOperationalDataset *)aJson_local,&local_1a8);
  PendingOperationalDataset::~PendingOperationalDataset(&local_1a8);
  StripComments(&local_1f8,local_c0);
  nlohmann::detail::input_adapter::
  input_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&local_1d8,&local_1f8);
  std::
  function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
  ::function(&local_218,(nullptr_t)0x0);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::parse((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           *)local_1c8,&local_1d8,&local_218,true);
  std::
  function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
  ::~function(&local_218);
  nlohmann::detail::input_adapter::~input_adapter(&local_1d8);
  std::__cxx11::string::~string((string *)&local_1f8);
  bVar1 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::is_null((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)local_1c8);
  if (bVar1) {
    PendingDatasetFromJson::anon_class_1_0_00000001::operator()(&local_272);
    local_58 = &local_270;
    local_60 = &local_271;
    bVar2 = ::fmt::v10::operator()(local_60);
    local_268 = bVar2.size_;
    local_270 = (v10 *)bVar2.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_68 = &local_260;
    local_78 = local_270;
    sStack_70 = local_268;
    local_50 = &local_78;
    local_88 = local_270;
    local_80 = local_268;
    local_48 = local_88;
    sStack_40 = local_80;
    error = (Error *)::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_30 = local_98;
    local_38 = &error;
    local_20 = 0;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_80;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_38;
    local_28 = local_38;
    local_18 = local_30;
    local_10 = local_38;
    ::fmt::v10::vformat_abi_cxx11_(&local_260,local_88,fmt,args);
    Error::Error(&local_240,kNotFound,&local_260);
    Error::operator=(__return_storage_ptr__,&local_240);
    Error::~Error(&local_240);
    std::__cxx11::string::~string((string *)&local_260);
  }
  else {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::operator_PendingOperationalDataset<ot::commissioner::PendingOperationalDataset,_0>
              ((PendingOperationalDataset *)&e_1,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_1c8);
    PendingOperationalDataset::operator=
              ((PendingOperationalDataset *)aJson_local,(PendingOperationalDataset *)&e_1);
    PendingOperationalDataset::~PendingOperationalDataset((PendingOperationalDataset *)&e_1);
  }
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)local_1c8);
  return __return_storage_ptr__;
}

Assistant:

Error PendingDatasetFromJson(PendingOperationalDataset &aDataset, const std::string &aJson)
{
    Error error;

    aDataset = PendingOperationalDataset{};

    try
    {
        Json json = Json::parse(StripComments(aJson));
        if (json.is_null())
        {
            error = ERROR_NOT_FOUND("Empty pending operational dataset from JSON");
        }
        else
        {
            aDataset = json;
        }
    } catch (JsonException &e)
    {
        error = e.GetError();
    } catch (std::exception &e)
    {
        error = {ErrorCode::kInvalidArgs, e.what()};
    }

    return error;
}